

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

BoundSheet *
Excel::Parser::parseBoundSheet(BoundSheet *__return_storage_ptr__,Record *record,BiffVersion ver)

{
  RecordSubstream *this;
  BiffVersion in_R9D;
  int16_t sheetType;
  int32_t pos;
  wstring sheetName;
  wstring local_40;
  
  pos = 0;
  sheetType = 0;
  sheetName._M_dataplus._M_p = (pointer)&sheetName.field_2;
  sheetName._M_string_length = 0;
  sheetName.field_2._M_local_buf[0] = L'\0';
  this = &record->m_stream;
  Stream::read<int>(&this->super_Stream,&pos,4);
  Stream::read<short>(&this->super_Stream,&sheetType,2);
  loadString_abi_cxx11_
            (&local_40,(Excel *)this,(Stream *)&record->m_borders,
             (vector<int,_std::allocator<int>_> *)0x1,ver,in_R9D);
  std::__cxx11::wstring::operator=((wstring *)&sheetName,(wstring *)&local_40);
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  __return_storage_ptr__->m_BOFPosition = pos;
  __return_storage_ptr__->m_sheetType = (uint)sheetType._1_1_ << 8;
  std::__cxx11::wstring::wstring
            ((wstring *)&__return_storage_ptr__->m_sheetName,(wstring *)&sheetName);
  std::__cxx11::wstring::~wstring((wstring *)&sheetName);
  return __return_storage_ptr__;
}

Assistant:

inline BoundSheet
Parser::parseBoundSheet( Record & record, BOF::BiffVersion ver )
{
	int32_t pos = 0;
	int16_t sheetType = 0;
	std::wstring sheetName;

	record.dataStream().read( pos, 4 );

	record.dataStream().read( sheetType, 2 );

	sheetName = loadString( record.dataStream(), record.borders(), 1, ver );

	return BoundSheet( pos,
		BoundSheet::convertSheetType( sheetType ),
		sheetName );
}